

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_pad_rect(nk_rect r,nk_vec2 pad)

{
  nk_rect nVar1;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  nk_vec2 pad_local;
  nk_rect r_local;
  
  r_local.x = r.w;
  local_30 = pad.x;
  if (local_30 * 2.0 <= r_local.x) {
    local_34 = r_local.x;
  }
  else {
    local_34 = local_30 * 2.0;
  }
  r_local.y = r.h;
  uStack_2c = pad.y;
  if (uStack_2c * 2.0 <= r_local.y) {
    local_38 = r_local.y;
  }
  else {
    local_38 = uStack_2c * 2.0;
  }
  pad_local.x = r.x;
  pad_local.y = r.y;
  nVar1.w = local_34 - (local_30 + local_30);
  nVar1.h = local_38 - (uStack_2c + uStack_2c);
  nVar1.x = pad_local.x + local_30;
  nVar1.y = pad_local.y + uStack_2c;
  return nVar1;
}

Assistant:

NK_LIB struct nk_rect
nk_pad_rect(struct nk_rect r, struct nk_vec2 pad)
{
    r.w = NK_MAX(r.w, 2 * pad.x);
    r.h = NK_MAX(r.h, 2 * pad.y);
    r.x += pad.x; r.y += pad.y;
    r.w -= 2 * pad.x;
    r.h -= 2 * pad.y;
    return r;
}